

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceHPoint.cpp
# Opt level: O0

HPoint __thiscall IceMaths::HPoint::operator*(HPoint *this,Matrix4x4 *mat)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float *in_RDX;
  float fVar9;
  HPoint HVar10;
  Matrix4x4 *mat_local;
  HPoint *this_local;
  
  fVar9 = mat->m[0][3] * in_RDX[0xd] +
          mat->m[0][2] * in_RDX[9] + mat->m[0][0] * in_RDX[1] + mat->m[0][1] * in_RDX[5];
  fVar1 = mat->m[0][0];
  fVar2 = in_RDX[2];
  fVar3 = mat->m[0][1];
  fVar4 = in_RDX[6];
  fVar5 = mat->m[0][2];
  fVar6 = in_RDX[10];
  fVar7 = mat->m[0][3];
  fVar8 = in_RDX[0xe];
  HVar10.super_Point.x =
       mat->m[0][3] * in_RDX[0xf] +
       mat->m[0][2] * in_RDX[0xb] + mat->m[0][0] * in_RDX[3] + mat->m[0][1] * in_RDX[7];
  (this->super_Point).x =
       mat->m[0][3] * in_RDX[0xc] +
       mat->m[0][2] * in_RDX[8] + mat->m[0][0] * *in_RDX + mat->m[0][1] * in_RDX[4];
  (this->super_Point).y = fVar9;
  (this->super_Point).z = fVar7 * fVar8 + fVar5 * fVar6 + fVar1 * fVar2 + fVar3 * fVar4;
  HVar10.super_Point.y = 0.0;
  this->w = HVar10.super_Point.x;
  HVar10.super_Point.z = fVar9;
  HVar10.w = 0.0;
  return HVar10;
}

Assistant:

HPoint HPoint::operator*(const Matrix4x4& mat) const
{
	return HPoint(
	x * mat.m[0][0] + y * mat.m[1][0] + z * mat.m[2][0] + w * mat.m[3][0],
	x * mat.m[0][1] + y * mat.m[1][1] + z * mat.m[2][1] + w * mat.m[3][1],
	x * mat.m[0][2] + y * mat.m[1][2] + z * mat.m[2][2] + w * mat.m[3][2],
	x * mat.m[0][3] + y * mat.m[1][3] + z * mat.m[2][3] + w * mat.m[3][3]);
}